

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O1

void tool_help(char *category)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  category_descriptors *pcVar5;
  bool bVar6;
  
  puts("Usage: curl [options...] <url>");
  if (category == (char *)0x0) {
    print_category(0x200);
    puts(
        "\nThis is not the full help, this menu is stripped into categories.\nUse \"--help category\" to get an overview of all categories.\nFor all options use the manual or \"--help all\"."
        );
  }
  else {
    iVar2 = curl_strequal(category,"all");
    if (iVar2 == 0) {
      iVar2 = curl_strequal(category,"category");
      if (iVar2 == 0) {
        pcVar3 = "auth";
        iVar2 = curl_strequal("auth",category);
        bVar6 = iVar2 == 0;
        if (bVar6) {
          lVar4 = 0;
          do {
            pcVar3 = *(char **)((long)&categories[1].opt + lVar4);
            iVar2 = curl_strequal(pcVar3,category);
            bVar6 = iVar2 == 0;
            if (!bVar6) {
              pcVar5 = (category_descriptors *)(lVar4 + 0x12cdd8);
              goto LAB_001128f9;
            }
            lVar4 = lVar4 + 0x18;
          } while (lVar4 != 0x1f8);
        }
        else {
          pcVar5 = categories;
LAB_001128f9:
          printf("%s: %s\n",pcVar3,pcVar5->desc);
          print_category(pcVar5->category);
        }
        if (bVar6) {
          puts("Invalid category provided, here is a list of all categories:\n");
          lVar4 = 0x18;
          pcVar3 = "auth";
          do {
            pcVar1 = *(char **)((long)&categories[0].opt + lVar4);
            printf(" %-11s %s\n",pcVar3,*(undefined8 *)((long)&helptext[0xea].categories + lVar4));
            lVar4 = lVar4 + 0x18;
            pcVar3 = pcVar1;
          } while (lVar4 != 0x228);
        }
      }
      else {
        lVar4 = 0x18;
        pcVar3 = "auth";
        do {
          pcVar1 = *(char **)((long)&categories[0].opt + lVar4);
          printf(" %-11s %s\n",pcVar3,*(undefined8 *)((long)&helptext[0xea].categories + lVar4));
          lVar4 = lVar4 + 0x18;
          pcVar3 = pcVar1;
        } while (lVar4 != 0x228);
      }
    }
    else {
      print_category(0xfffffffe);
    }
  }
  free(category);
  return;
}

Assistant:

void tool_help(char *category)
{
  puts("Usage: curl [options...] <url>");
  /* If no category was provided */
  if(!category) {
    const char *category_note = "\nThis is not the full help, this "
      "menu is stripped into categories.\nUse \"--help category\" to get "
      "an overview of all categories.\nFor all options use the manual"
      " or \"--help all\".";
    print_category(CURLHELP_IMPORTANT);
    puts(category_note);
  }
  /* Lets print everything if "all" was provided */
  else if(curl_strequal(category, "all"))
    /* Print everything except hidden */
    print_category(~(CURLHELP_HIDDEN));
  /* Lets handle the string "category" differently to not print an errormsg */
  else if(curl_strequal(category, "category"))
    get_categories();
  /* Otherwise print category and handle the case if the cat was not found */
  else if(get_category_content(category)) {
    puts("Invalid category provided, here is a list of all categories:\n");
    get_categories();
  }
  free(category);
}